

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::readImage
          (DefaultFBOMultisampleCase *this,Surface *dst)

{
  int x;
  int y;
  RenderContext *context;
  PixelBufferAccess PStack_48;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  x = this->m_viewportX;
  y = this->m_viewportY;
  tcu::Surface::getAccess(&PStack_48,dst);
  glu::readPixels(context,x,y,&PStack_48);
  return;
}

Assistant:

void DefaultFBOMultisampleCase::readImage (tcu::Surface& dst) const
{
	glu::readPixels(m_context.getRenderContext(), m_viewportX, m_viewportY, dst.getAccess());
}